

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

void gz_reset(gz_statep state)

{
  if (state->mode == 0x1c4f) {
    state->have = 0;
    state->eof = 0;
    state->how = 0;
    state->direct = 1;
  }
  state->seek = 0;
  gz_error(state,0,(char *)0x0);
  state->pos = 0;
  (state->strm).avail_in = 0;
  return;
}

Assistant:

local void gz_reset(gz_statep state)
{
    if (state->mode == GZ_READ) {   /* for reading ... */
        state->have = 0;            /* no output data available */
        state->eof = 0;             /* not at end of file */
        state->how = LOOK;          /* look for gzip header */
        state->direct = 1;          /* default for empty file */
    }
    state->seek = 0;                /* no seek request pending */
    gz_error(state, Z_OK, NULL);    /* clear error */
    state->pos = 0;                 /* no uncompressed data yet */
    state->strm.avail_in = 0;       /* no input data yet */
}